

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-sys-linux.c
# Opt level: O2

raplcap_msr_sys_ctx * msr_sys_init(uint32_t *n_pkg,uint32_t *n_die)

{
  msr_topology *b;
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  msr_topology *topo;
  raplcap_msr_sys_ctx *ctx;
  uint32_t *__ptr;
  int *piVar4;
  char *pcVar5;
  int *piVar6;
  uint32_t uVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  FILE *pFVar11;
  uint uVar12;
  msr_topology *pmVar13;
  uint uVar14;
  ulong uVar15;
  char local_58 [40];
  
  if (n_pkg == (uint32_t *)0x0) {
    __assert_fail("n_pkg",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-sys-linux.c"
                  ,0xdf,"raplcap_msr_sys_ctx *msr_sys_init(uint32_t *, uint32_t *)");
  }
  if (n_die != (uint32_t *)0x0) {
    uVar1 = get_cpu_count();
    if (uVar1 == 0) {
      fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
      pFVar11 = _stderr;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      pcVar9 = "msr_sys_init: get_cpu_count";
    }
    else {
      uVar10 = (ulong)uVar1;
      topo = (msr_topology *)malloc(uVar10 * 0xc);
      if (topo != (msr_topology *)0x0) {
        iVar2 = get_topology(topo,uVar1);
        if (iVar2 == 0) {
          qsort(topo,uVar10,0xc,cmp_msr_topology_pkg_die);
          ctx = (raplcap_msr_sys_ctx *)malloc(0x18);
          if (ctx == (raplcap_msr_sys_ctx *)0x0) {
            fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
            pFVar11 = _stderr;
            piVar4 = __errno_location();
            pcVar5 = strerror(*piVar4);
            fprintf(pFVar11,"%s: %s\n","msr_sys_init: malloc",pcVar5);
            free(topo);
            return (raplcap_msr_sys_ctx *)0x0;
          }
          uVar7 = topo[uVar1 - 1].pkg + 1;
          ctx->n_pkg = uVar7;
          uVar1 = topo[uVar1 - 1].die + 1;
          ctx->n_die = uVar1;
          uVar12 = 1;
          pmVar13 = topo;
          uVar15 = uVar10;
          while (uVar15 = uVar15 - 1, uVar15 != 0) {
            iVar2 = cmp_msr_topology_pkg_die(pmVar13 + 1,pmVar13);
            uVar12 = (uVar12 + 1) - (uint)(iVar2 == 0);
            pmVar13 = pmVar13 + 1;
          }
          ctx->n_fds = uVar12;
          uVar15 = (ulong)uVar12;
          __ptr = (uint32_t *)malloc(uVar15 * 4);
          if (__ptr == (uint32_t *)0x0) {
            fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
            pFVar11 = _stderr;
            piVar4 = __errno_location();
            pcVar5 = strerror(*piVar4);
            fprintf(pFVar11,"%s: %s\n","msr_sys_init: malloc",pcVar5);
          }
          else {
            *__ptr = topo->cpu;
            uVar14 = 1;
            pmVar13 = topo;
            while( true ) {
              b = pmVar13;
              uVar10 = uVar10 - 1;
              pmVar13 = b + 1;
              if (uVar10 == 0) break;
              iVar2 = cmp_msr_topology_pkg_die(pmVar13,b);
              if (iVar2 != 0) {
                uVar8 = (ulong)uVar14;
                uVar14 = uVar14 + 1;
                __ptr[uVar8] = b[1].cpu;
              }
            }
            if (uVar14 != uVar12) {
              __assert_fail("j == n_cpus_to_open",
                            "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-sys-linux.c"
                            ,0xa6,
                            "void get_cpus_to_open(uint32_t *, uint32_t, const msr_topology *, uint32_t)"
                           );
            }
            piVar4 = (int *)calloc(uVar15,4);
            ctx->fds = piVar4;
            if (piVar4 != (int *)0x0) {
              pcVar5 = getenv("RAPLCAP_READ_ONLY");
              if (pcVar5 == (char *)0x0) {
                iVar2 = 2;
              }
              else {
                iVar2 = atoi(pcVar5);
                iVar2 = (uint)(iVar2 == 0) * 2;
              }
              uVar10 = 0;
              do {
                if (uVar15 == uVar10) {
                  free(__ptr);
                  free(topo);
                  *n_pkg = uVar7;
                  *n_die = uVar1;
                  return ctx;
                }
                uVar12 = __ptr[uVar10];
                snprintf(local_58,0x20,"/dev/cpu/%u/msr_safe",(ulong)uVar12);
                iVar3 = open(local_58,iVar2);
                if (iVar3 < 0) {
                  snprintf(local_58,0x20,"/dev/cpu/%u/msr",(ulong)uVar12);
                  iVar3 = open(local_58,iVar2);
                  if (iVar3 < 0) {
                    fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
                    pFVar11 = _stderr;
                    piVar6 = __errno_location();
                    pcVar5 = strerror(*piVar6);
                    fprintf(pFVar11,"%s: %s\n",local_58,pcVar5);
                    if (*piVar6 == 2) {
                      fprintf(_stderr,"%s [%s] ","[WARN] ","raplcap-msr");
                      fwrite("Is the msr kernel module loaded?\n",0x21,1,_stderr);
                    }
                    piVar4[uVar10] = iVar3;
                    iVar2 = *piVar6;
                    free(__ptr);
                    msr_sys_destroy(ctx);
                    free(topo);
                    *piVar6 = iVar2;
                    return (raplcap_msr_sys_ctx *)0x0;
                  }
                }
                piVar4[uVar10] = iVar3;
                uVar10 = uVar10 + 1;
              } while( true );
            }
            fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
            pFVar11 = _stderr;
            piVar4 = __errno_location();
            pcVar5 = strerror(*piVar4);
            fprintf(pFVar11,"%s: %s\n","msr_sys_init: calloc",pcVar5);
            free(__ptr);
          }
          free(ctx);
        }
        free(topo);
        return (raplcap_msr_sys_ctx *)0x0;
      }
      fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
      pFVar11 = _stderr;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      pcVar9 = "msr_sys_init: malloc";
    }
    fprintf(pFVar11,"%s: %s\n",pcVar9,pcVar5);
    return (raplcap_msr_sys_ctx *)0x0;
  }
  __assert_fail("n_die",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-sys-linux.c"
                ,0xe0,"raplcap_msr_sys_ctx *msr_sys_init(uint32_t *, uint32_t *)");
}

Assistant:

raplcap_msr_sys_ctx* msr_sys_init(uint32_t* n_pkg, uint32_t* n_die) {
  msr_topology* topo;
  raplcap_msr_sys_ctx* ctx;
  uint32_t* cpus_to_open;
  uint32_t ncpus;
  int err_save;
  assert(n_pkg);
  assert(n_die);
  // need to decide which CPU MSRs to open to cover all RAPL zones
  if ((ncpus = get_cpu_count()) == 0) {
    raplcap_perror(ERROR, "msr_sys_init: get_cpu_count");
    return NULL;
  }
  if ((topo = malloc(ncpus * sizeof(*topo))) == NULL) {
    raplcap_perror(ERROR, "msr_sys_init: malloc");
    return NULL;
  }
  // get topology for all CPUs, sort by pkg and die, then count unique combinations to determine how many MSRs to open
  if (get_topology(topo, ncpus)) {
    free(topo);
    return NULL;
  }
  qsort(topo, ncpus, sizeof(*topo), cmp_msr_topology_pkg_die);
  if ((ctx = malloc(sizeof(*ctx))) == NULL) {
    raplcap_perror(ERROR, "msr_sys_init: malloc");
    free(topo);
    return NULL;
  }
  // assumes homogeneous die configurations across packages
  ctx->n_pkg = topo[ncpus - 1].pkg + 1;
  ctx->n_die = topo[ncpus - 1].die + 1;
  ctx->n_fds = count_unique_pkg_die(topo, ncpus);
  raplcap_log(DEBUG, "msr_sys_init: n_cpus=%"PRIu32", n_pkg=%"PRIu32", n_die=%"PRIu32", n_fds=%"PRIu32"\n",
              ncpus, ctx->n_pkg, ctx->n_die, ctx->n_fds);
  // now determine which CPUs to open MSRs for and do it
  if ((cpus_to_open = malloc(ctx->n_fds * sizeof(uint32_t))) == NULL) {
    raplcap_perror(ERROR, "msr_sys_init: malloc");
    free(ctx);
    free(topo);
    return NULL;
  }
  get_cpus_to_open(cpus_to_open, ctx->n_fds, topo, ncpus);
  if ((ctx->fds = calloc(ctx->n_fds, sizeof(int))) == NULL) {
    raplcap_perror(ERROR, "msr_sys_init: calloc");
    free(cpus_to_open);
    free(ctx);
    free(topo);
    return NULL;
  }
  if (open_msrs(ctx->fds, cpus_to_open, ctx->n_fds)) {
    err_save = errno;
    free(cpus_to_open);
    msr_sys_destroy(ctx);
    free(topo);
    errno = err_save;
    return NULL;
  }
  free(cpus_to_open);
  free(topo);
  *n_pkg = ctx->n_pkg;
  *n_die = ctx->n_die;
  return ctx;
}